

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1604.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  int t;
  int iVar5;
  int *piVar6;
  long lVar7;
  bool bVar8;
  int iStack_138b0;
  int n;
  pair<int,_int> p [10000];
  
  lVar7 = 0;
  memset(p,0,80000);
  std::istream::operator>>((istream *)&std::cin,&n);
  piVar6 = &p[0].second;
  iVar5 = 0;
  while (lVar7 < n) {
    std::istream::operator>>((istream *)&std::cin,piVar6);
    iVar5 = iVar5 + *piVar6;
    lVar7 = lVar7 + 1;
    ((pair<int,_int> *)(piVar6 + -1))->first = (int)lVar7;
    piVar6 = piVar6 + 2;
  }
  std::
  __sort<std::pair<int,int>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<int,int>,std::pair<int,int>)>>
            (p,p + n,(_Iter_comp_iter<bool_(*)(std::pair<int,_int>,_std::pair<int,_int>)>)0x1011bc);
  do {
    bVar8 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar8) {
      return 0;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p[0].first);
    std::operator<<(poVar2," ");
    p[0].second = p[0].second + -1;
    if (p[1].second != 0) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p[1].first);
      std::operator<<(poVar2," ");
      p[1].second = p[1].second + -1;
    }
    uVar3 = 2;
    do {
      iVar1 = p[uVar3 - 1].second;
      uVar4 = 1;
      if (p[uVar3].second <= iVar1) break;
      p[uVar3 - 1].second = p[uVar3].second;
      p[uVar3].second = iVar1;
      iVar1 = (&iStack_138b0)[uVar3 * 2];
      (&iStack_138b0)[uVar3 * 2] = p[uVar3].first;
      p[uVar3].first = iVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
    do {
      iVar1 = p[uVar4 - 1].second;
      if (p[uVar4].second <= iVar1) break;
      p[uVar4 - 1].second = p[uVar4].second;
      p[uVar4].second = iVar1;
      iVar1 = (&iStack_138b0)[uVar4 * 2];
      (&iStack_138b0)[uVar4 * 2] = p[uVar4].first;
      p[uVar4].first = iVar1;
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
    if (p[0].second < 1) {
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    std::pair<int, int> p[10000];
    int n;
    std::cin >> n;
    int sum = 0;
    for (int i = 0; i < n; ++i) {
        std::cin >> p[i].second;
        sum += p[i].second;
        p[i].first = i + 1;
    }
    sort(p, p + n, comp);
    while (sum--) {
        std::cout << p[0].first << " ";
        p[0].second--;
        if (p[1].second != 0) {
            std::cout << p[1].first << " ";
            p[1].second--;
        }
        int j = 1, k = 2;
        while (p[j].second < p[k].second) {
            int t = p[j].second;
            p[j].second = p[k].second;
            p[k].second = t;
            t = p[j].first;
            p[j].first = p[k].first;
            p[k].first = t;
            k++;
            j++;
            if (k == n) {
                break;
            }
        }
        j = 0, k = 1;
        while (p[j].second < p[k].second) {
            int t = p[j].second;
            p[j].second = p[k].second;
            p[k].second = t;
            t = p[j].first;
            p[j].first = p[k].first;
            p[k].first = t;
            k++;
            j++;
            if (k == n) {
                break;
            }
        }
        if (p[0].second <= 0) {
            return 0;
        }
    }
    return 0;
}